

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O1

vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> * __thiscall
KDIS::DATA_TYPE::VariableDatum::GetDatumValueAsKUINT64
          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *__return_storage_ptr__,
          VariableDatum *this)

{
  pointer pDVar1;
  pointer pDVar2;
  iterator __position;
  double dVar3;
  char cVar4;
  KUINT16 i;
  long lVar5;
  unsigned_long_long *puVar6;
  int iVar7;
  undefined8 local_40;
  unsigned_long_long local_38;
  
  if (UTILS::IsMachineBigEndian()::conv == '\0') {
    GetDatumValueAsKUINT64();
  }
  cVar4 = UTILS::IsMachineBigEndian()::conv;
  pDVar1 = (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar3 = ceil((double)this->m_ui32DatumLength * 0.125);
  if ((pDVar1 != pDVar2) && (7 < (uint)(long)dVar3)) {
    iVar7 = 0;
    do {
      lVar5 = 0;
      do {
        *(KOCTET *)((long)&local_40 + lVar5) = pDVar1->Buffer[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 8);
      if (cVar4 == '\x01') {
        local_38 = local_40;
        lVar5 = 8;
        puVar6 = &local_40;
        do {
          *(undefined1 *)puVar6 = *(undefined1 *)((long)&local_40 + lVar5 + 7);
          puVar6 = (unsigned_long_long *)((long)puVar6 + 1);
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
        _M_realloc_insert<unsigned_long_long>(__return_storage_ptr__,__position,&local_40);
      }
      else {
        *__position._M_current = local_40;
        (__return_storage_ptr__->
        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    } while ((pDVar1 != pDVar2) && (iVar7 = iVar7 + 8, 7 < (uint)(long)dVar3 - iVar7));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<KUINT64> VariableDatum::GetDatumValueAsKUINT64() const
{
    KBOOL bSwapBytes = !IsMachineBigEndian();

    vector<DatumEntry>::const_iterator citr = m_v8DatumValue.begin();
    vector<DatumEntry>::const_iterator citrEnd = m_v8DatumValue.end();

    vector<KUINT64> m_Return;

    KUINT32 ui32CurrentPos = 0;
    KUINT32 ui32LengthInOctets = ceil(m_ui32DatumLength / 8.0);

    while( citr != citrEnd )
    {
        if( ( ui32LengthInOctets - ui32CurrentPos ) < 8 )break;

        m_Return.push_back( NetToKUINT64( citr->Buffer, bSwapBytes ).m_Value );

        ui32CurrentPos += 8;
    }

    return m_Return;
}